

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O0

int ecx_readPDOassign(ecx_contextt *context,uint16 Slave,uint16 PDOassign)

{
  uint local_34 [2];
  int32 rdat2;
  int rdl;
  int bsize;
  int wkc;
  uint16 local_1c;
  ushort uStack_1a;
  uint8 subcnt;
  uint16 subidx;
  uint16 idx;
  uint16 rdat;
  uint16 subidxloop;
  uint16 nidx;
  uint16 idxloop;
  uint16 PDOassign_local;
  uint16 Slave_local;
  ecx_contextt *context_local;
  
  rdat2 = 0;
  local_34[1] = 2;
  local_1c = 0;
  rdat = PDOassign;
  subidxloop = Slave;
  _nidx = context;
  rdl = ecx_SDOread(context,Slave,PDOassign,'\0','\0',(int *)(local_34 + 1),&local_1c,700000);
  if ((0 < rdl) && (local_1c != 0)) {
    subidx = local_1c;
    rdat2 = 0;
    for (idx = 1; idx <= subidx; idx = idx + 1) {
      local_34[1] = 2;
      local_1c = 0;
      rdl = ecx_SDOread(_nidx,subidxloop,rdat,(uint8)idx,'\0',(int *)(local_34 + 1),&local_1c,700000
                       );
      wkc._2_2_ = local_1c;
      if (local_1c != 0) {
        local_34[1] = 1;
        bsize._3_1_ = 0;
        rdl = ecx_SDOread(_nidx,subidxloop,local_1c,'\0','\0',(int *)(local_34 + 1),
                          (void *)((long)&bsize + 3),700000);
        wkc._0_2_ = (ushort)bsize._3_1_;
        for (uStack_1a = 1; uStack_1a <= (ushort)wkc; uStack_1a = uStack_1a + 1) {
          local_34[1] = 4;
          local_34[0] = 0;
          rdl = ecx_SDOread(_nidx,subidxloop,wkc._2_2_,(uint8)uStack_1a,'\0',(int *)(local_34 + 1),
                            local_34,700000);
          if ((local_34[0] & 0xff) < 0xff) {
            rdat2 = (local_34[0] & 0xff) + rdat2;
          }
          else {
            local_1c = 0xff;
            rdat2 = rdat2 + 0xff;
          }
        }
      }
    }
  }
  return rdat2;
}

Assistant:

int ecx_readPDOassign(ecx_contextt *context, uint16 Slave, uint16 PDOassign)
{
   uint16 idxloop, nidx, subidxloop, rdat, idx, subidx;
   uint8 subcnt;
   int wkc, bsize = 0, rdl;
   int32 rdat2;

   rdl = sizeof(rdat); rdat = 0;
   /* read PDO assign subindex 0 ( = number of PDO's) */
   wkc = ecx_SDOread(context, Slave, PDOassign, 0x00, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
   rdat = etohs(rdat);
   /* positive result from slave ? */
   if ((wkc > 0) && (rdat > 0))
   {
      /* number of available sub indexes */
      nidx = rdat;
      bsize = 0;
      /* read all PDO's */
      for (idxloop = 1; idxloop <= nidx; idxloop++)
      {
         rdl = sizeof(rdat); rdat = 0;
         /* read PDO assign */
         wkc = ecx_SDOread(context, Slave, PDOassign, (uint8)idxloop, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
         /* result is index of PDO */
         idx = etohl(rdat);
         if (idx > 0)
         {
            rdl = sizeof(subcnt); subcnt = 0;
            /* read number of subindexes of PDO */
            wkc = ecx_SDOread(context, Slave,idx, 0x00, FALSE, &rdl, &subcnt, EC_TIMEOUTRXM);
            subidx = subcnt;
            /* for each subindex */
            for (subidxloop = 1; subidxloop <= subidx; subidxloop++)
            {
               rdl = sizeof(rdat2); rdat2 = 0;
               /* read SDO that is mapped in PDO */
               wkc = ecx_SDOread(context, Slave, idx, (uint8)subidxloop, FALSE, &rdl, &rdat2, EC_TIMEOUTRXM);
               rdat2 = etohl(rdat2);
               /* extract bitlength of SDO */
               if (LO_BYTE(rdat2) < 0xff)
               {
                  bsize += LO_BYTE(rdat2);
               }
               else
               {
                  rdl = sizeof(rdat); rdat = htoes(0xff);
                  /* read Object Entry in Object database */
//                  wkc = ec_readOEsingle(idx, (uint8)SubCount, pODlist, pOElist);
                  bsize += etohs(rdat);                  
               }
            }
         }
      }
   }
   /* return total found bitlength (PDO) */
   return bsize;
}